

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_global_init(long flags)

{
  CURLcode CVar1;
  CURLcode result;
  long flags_local;
  
  curl_simple_lock_lock(&s_lock);
  CVar1 = global_init(flags,true);
  curl_simple_lock_unlock(&s_lock);
  return CVar1;
}

Assistant:

CURLcode curl_global_init(long flags)
{
  CURLcode result;
  global_init_lock();

  result = global_init(flags, TRUE);

  global_init_unlock();

  return result;
}